

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<char16_t>::dispose(ArrayBuilder<char16_t> *this)

{
  char16_t *pcVar1;
  RemoveConst<char16_t> *pRVar2;
  char16_t *pcVar3;
  
  pcVar1 = this->ptr;
  if (pcVar1 != (char16_t *)0x0) {
    pRVar2 = this->pos;
    pcVar3 = this->endPtr;
    this->endPtr = (char16_t *)0x0;
    this->ptr = (char16_t *)0x0;
    this->pos = (RemoveConst<char16_t> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pcVar1,2,(long)pRVar2 - (long)pcVar1 >> 1,
               (long)pcVar3 - (long)pcVar1 >> 1,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }